

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O2

void __thiscall
Effects_Buffer::mix_enhanced(Effects_Buffer *this,blip_sample_t *out_,blargg_long count)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  short *psVar14;
  short *psVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  fixed_t fVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  byte bVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  ushort uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  int local_ec;
  int local_e8;
  int local_e4;
  
  uVar1 = *(undefined4 *)&this->field_0xb8;
  lVar7 = *(long *)&this->field_0xa8;
  local_e4 = *(int *)&this->field_0xb4;
  lVar8 = *(long *)&this->field_0xe8;
  local_e8 = *(int *)&this->field_0xf4;
  lVar9 = *(long *)&this->field_0x128;
  local_ec = *(int *)&this->field_0x134;
  lVar10 = *(long *)&this->field_0x168;
  iVar26 = *(int *)&this->field_0x174;
  lVar11 = *(long *)&this->field_0x1a8;
  iVar34 = *(int *)&this->field_0x1b4;
  lVar12 = *(long *)&this->field_0x28;
  uVar35 = this->reverb_pos;
  uVar36 = this->echo_pos;
  iVar27 = *(int *)&this->field_0x34;
  lVar13 = *(long *)&this->field_0x68;
  psVar14 = (this->reverb_buf).begin_;
  psVar15 = (this->echo_buf).begin_;
  lVar16 = (this->chans).pan_1_levels[0];
  lVar17 = (this->chans).pan_2_levels[0];
  iVar2 = (this->chans).reverb_delay_l;
  lVar18 = (this->chans).pan_1_levels[1];
  lVar19 = (this->chans).pan_2_levels[1];
  iVar3 = (this->chans).reverb_delay_r;
  fVar20 = (this->chans).reverb_level;
  lVar21 = (this->chans).echo_level;
  iVar4 = (this->chans).echo_delay_l;
  iVar5 = (this->chans).echo_delay_r;
  iVar29 = *(int *)&this->field_0x74;
  for (lVar25 = 0; count != (int)lVar25; lVar25 = lVar25 + 1) {
    iVar23 = iVar27 >> 0xe;
    bVar24 = (byte)uVar1;
    iVar27 = (iVar27 - (iVar27 >> (bVar24 & 0x1f))) + *(int *)(lVar12 + lVar25 * 4);
    iVar6 = *(int *)(lVar13 + lVar25 * 4);
    iVar33 = (int)((ulong)(lVar17 * (iVar29 >> 0xe)) >> 0xf) +
             (int)((ulong)(lVar16 * iVar23) >> 0xf) + (local_e8 >> 0xe) +
             (int)psVar14[iVar2 + uVar35 & 0x3fff];
    iVar31 = (int)((ulong)((iVar29 >> 0xe) * lVar19) >> 0xf) +
             (int)((ulong)(iVar23 * lVar18) >> 0xf) + (local_ec >> 0xe) +
             (int)psVar14[iVar3 + uVar35 & 0x3fff];
    local_e8 = (local_e8 - (local_e8 >> (bVar24 & 0x1f))) + *(int *)(lVar8 + lVar25 * 4);
    local_ec = (local_ec - (local_ec >> (bVar24 & 0x1f))) + *(int *)(lVar9 + lVar25 * 4);
    iVar23 = (int)fVar20;
    psVar14[(int)uVar35] = (short)((uint)(iVar23 * iVar33) >> 0xf);
    iVar28 = local_e4 >> 0xe;
    psVar14[(long)(int)uVar35 + 1] = (short)((uint)(iVar31 * iVar23) >> 0xf);
    local_e4 = (local_e4 - (local_e4 >> (bVar24 & 0x1f))) + *(int *)(lVar7 + lVar25 * 4);
    uVar30 = (iVar26 >> 0xe) + iVar28 + iVar33 +
             (int)((ulong)(psVar15[iVar4 + uVar36 & 0xfff] * lVar21) >> 0xf);
    iVar23 = (iVar34 >> 0xe) + iVar28 + iVar31 +
             (int)((ulong)(psVar15[iVar5 + uVar36 & 0xfff] * lVar21) >> 0xf);
    iVar26 = (iVar26 - (iVar26 >> (bVar24 & 0x1f))) + *(int *)(lVar10 + lVar25 * 4);
    iVar34 = (iVar34 - (iVar34 >> (bVar24 & 0x1f))) + *(int *)(lVar11 + lVar25 * 4);
    psVar15[(int)uVar36] = (short)iVar28;
    uVar22 = (int)uVar30 >> 0x18 ^ 0x7fff;
    if ((int)(short)uVar30 == uVar30) {
      uVar22 = uVar30;
    }
    out_[lVar25 * 2] = (blip_sample_t)uVar22;
    uVar32 = (short)(char)((uint)iVar23 >> 0x18) ^ 0x7fff;
    if ((short)(ushort)iVar23 == iVar23) {
      uVar32 = (ushort)iVar23;
    }
    out_[lVar25 * 2 + 1] = uVar32;
    uVar35 = uVar35 + 2 & 0x3fff;
    uVar36 = uVar36 + 1 & 0xfff;
    iVar29 = (iVar29 - (iVar29 >> (bVar24 & 0x1f))) + iVar6;
  }
  this->reverb_pos = uVar35;
  this->echo_pos = uVar36;
  *(int *)&this->field_0xf4 = local_e8;
  *(int *)&this->field_0x134 = local_ec;
  *(int *)&this->field_0x174 = iVar26;
  *(int *)&this->field_0x1b4 = iVar34;
  *(int *)&this->field_0x34 = iVar27;
  *(int *)&this->field_0x74 = iVar29;
  *(int *)&this->field_0xb4 = local_e4;
  return;
}

Assistant:

void Effects_Buffer::mix_enhanced( blip_sample_t* out_, blargg_long count )
{
	blip_sample_t* BLIP_RESTRICT out = out_;
	int const bass = BLIP_READER_BASS( bufs [2] );
	BLIP_READER_BEGIN( center, bufs [2] );
	BLIP_READER_BEGIN( l1, bufs [3] );
	BLIP_READER_BEGIN( r1, bufs [4] );
	BLIP_READER_BEGIN( l2, bufs [5] );
	BLIP_READER_BEGIN( r2, bufs [6] );
	BLIP_READER_BEGIN( sq1, bufs [0] );
	BLIP_READER_BEGIN( sq2, bufs [1] );
	
	blip_sample_t* const reverb_buf = this->reverb_buf.begin();
	blip_sample_t* const echo_buf = this->echo_buf.begin();
	int echo_pos = this->echo_pos;
	int reverb_pos = this->reverb_pos;
	
	while ( count-- )
	{
		int sum1_s = BLIP_READER_READ( sq1 );
		int sum2_s = BLIP_READER_READ( sq2 );
		
		BLIP_READER_NEXT( sq1, bass );
		BLIP_READER_NEXT( sq2, bass );
		
		int new_reverb_l = FMUL( sum1_s, chans.pan_1_levels [0] ) +
				FMUL( sum2_s, chans.pan_2_levels [0] ) + BLIP_READER_READ( l1 ) +
				reverb_buf [(reverb_pos + chans.reverb_delay_l) & reverb_mask];
		
		int new_reverb_r = FMUL( sum1_s, chans.pan_1_levels [1] ) +
				FMUL( sum2_s, chans.pan_2_levels [1] ) + BLIP_READER_READ( r1 ) +
				reverb_buf [(reverb_pos + chans.reverb_delay_r) & reverb_mask];
		
		BLIP_READER_NEXT( l1, bass );
		BLIP_READER_NEXT( r1, bass );
		
		fixed_t reverb_level = chans.reverb_level;
		reverb_buf [reverb_pos] = (blip_sample_t) FMUL( new_reverb_l, reverb_level );
		reverb_buf [reverb_pos + 1] = (blip_sample_t) FMUL( new_reverb_r, reverb_level );
		reverb_pos = (reverb_pos + 2) & reverb_mask;
		
		int sum3_s = BLIP_READER_READ( center );
		BLIP_READER_NEXT( center, bass );
		
		int left = new_reverb_l + sum3_s + BLIP_READER_READ( l2 ) + FMUL( chans.echo_level,
				echo_buf [(echo_pos + chans.echo_delay_l) & echo_mask] );
		int right = new_reverb_r + sum3_s + BLIP_READER_READ( r2 ) + FMUL( chans.echo_level,
				echo_buf [(echo_pos + chans.echo_delay_r) & echo_mask] );
		
		BLIP_READER_NEXT( l2, bass );
		BLIP_READER_NEXT( r2, bass );
		
		echo_buf [echo_pos] = sum3_s;
		echo_pos = (echo_pos + 1) & echo_mask;
		
		if ( (BOOST::int16_t) left != left )
			left = 0x7FFF - (left >> 24);
		
		out [0] = left;
		out [1] = right;
		
		out += 2;
		
		if ( (BOOST::int16_t) right != right )
			out [-1] = 0x7FFF - (right >> 24);
	}
	this->reverb_pos = reverb_pos;
	this->echo_pos = echo_pos;
	
	BLIP_READER_END( l1, bufs [3] );
	BLIP_READER_END( r1, bufs [4] );
	BLIP_READER_END( l2, bufs [5] );
	BLIP_READER_END( r2, bufs [6] );
	BLIP_READER_END( sq1, bufs [0] );
	BLIP_READER_END( sq2, bufs [1] );
	BLIP_READER_END( center, bufs [2] );
}